

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

common_chat_templates_ptr
common_chat_templates_init
          (llama_model *model,string *chat_template_override,string *bos_token_override,
          string *eos_token_override)

{
  _Alloc_hider _Var1;
  bool bVar2;
  llama_token lVar3;
  long lVar4;
  undefined8 *puVar5;
  string *in_R8;
  bool bVar6;
  string default_template_src;
  string local_c8;
  string template_tool_use_src;
  llama_vocab *vocab;
  string token_eos;
  string token_bos;
  anon_class_24_3_9d428893 get_token;
  
  default_template_src._M_dataplus._M_p = (pointer)&default_template_src.field_2;
  default_template_src._M_string_length = 0;
  template_tool_use_src._M_dataplus._M_p = (pointer)&template_tool_use_src.field_2;
  template_tool_use_src._M_string_length = 0;
  default_template_src.field_2._M_local_buf[0] = '\0';
  template_tool_use_src.field_2._M_local_buf[0] = '\0';
  if (bos_token_override->_M_string_length == 0) {
    if (chat_template_override == (string *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/chat.cpp"
                 ,0x17b,"GGML_ASSERT(%s) failed","model != nullptr");
    }
    lVar4 = llama_model_chat_template(chat_template_override,0);
    bVar6 = lVar4 != 0;
    if (bVar6) {
      std::__cxx11::string::assign((char *)&default_template_src);
    }
    lVar4 = llama_model_chat_template(chat_template_override,"tool_use");
    if (lVar4 != 0) {
      bVar6 = true;
      std::__cxx11::string::assign((char *)&template_tool_use_src);
    }
  }
  else {
    bVar6 = true;
    std::__cxx11::string::_M_assign((string *)&default_template_src);
  }
  if (default_template_src._M_string_length != 0) {
    bVar2 = std::operator==(&default_template_src,"chatml");
    if (!bVar2) goto LAB_0016fdb1;
  }
  if (template_tool_use_src._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&default_template_src);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&default_template_src);
  }
LAB_0016fdb1:
  std::__cxx11::string::string((string *)&token_bos,(string *)eos_token_override);
  std::__cxx11::string::string((string *)&token_eos,in_R8);
  if (chat_template_override != (string *)0x0) {
    vocab = (llama_vocab *)llama_model_get_vocab(chat_template_override);
    get_token.vocab = &vocab;
    get_token.template_tool_use_src = &template_tool_use_src;
    get_token.default_template_src = &default_template_src;
    lVar3 = llama_vocab_bos(vocab);
    common_chat_templates_init(llama_model_const*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_(&local_c8,&get_token,lVar3,"BOS","bos_token");
    std::__cxx11::string::operator=((string *)&token_bos,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    lVar3 = llama_vocab_eos(vocab);
    common_chat_templates_init(llama_model_const*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_(&local_c8,&get_token,lVar3,"EOS","eos_token");
    std::__cxx11::string::operator=((string *)&token_eos,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  puVar5 = (undefined8 *)operator_new(0x18);
  puVar5[2] = 0;
  *puVar5 = 0;
  puVar5[1] = 0;
  *(undefined8 **)model = puVar5;
  *(bool *)puVar5 = bVar6;
  std::
  make_unique<minja::chat_template,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            (&local_c8,&default_template_src,&token_bos);
  _Var1._M_p = local_c8._M_dataplus._M_p;
  local_c8._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>::reset
            ((__uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
             (puVar5 + 1),(pointer)_Var1._M_p);
  std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::~unique_ptr
            ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
             &local_c8);
  if (template_tool_use_src._M_string_length != 0) {
    std::
    make_unique<minja::chat_template,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              (&local_c8,&template_tool_use_src,&token_bos);
    _Var1._M_p = local_c8._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>::reset
              ((__uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
               (puVar5 + 2),(pointer)_Var1._M_p);
    std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::~unique_ptr
              ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_> *)
               &local_c8);
  }
  std::__cxx11::string::~string((string *)&token_eos);
  std::__cxx11::string::~string((string *)&token_bos);
  std::__cxx11::string::~string((string *)&template_tool_use_src);
  std::__cxx11::string::~string((string *)&default_template_src);
  return (__uniq_ptr_data<common_chat_templates,_common_chat_templates_deleter,_true,_true>)
         (__uniq_ptr_data<common_chat_templates,_common_chat_templates_deleter,_true,_true>)model;
}

Assistant:

common_chat_templates_ptr common_chat_templates_init(
    const struct llama_model * model,
    const std::string & chat_template_override,
    const std::string & bos_token_override,
    const std::string & eos_token_override)
{
    std::string default_template_src;
    std::string template_tool_use_src;

    bool has_explicit_template = !chat_template_override.empty();
    if (chat_template_override.empty()) {
        GGML_ASSERT(model != nullptr);
        const auto * str = llama_model_chat_template(model, /* name */ nullptr);
        if (str) {
            default_template_src = str;
            has_explicit_template = true;
        }
        str = llama_model_chat_template(model, /* name */ "tool_use");
        if (str) {
            template_tool_use_src = str;
            has_explicit_template = true;
        }
    } else {
        default_template_src = chat_template_override;
    }
    if (default_template_src.empty() || default_template_src == "chatml") {
        if (!template_tool_use_src.empty()) {
            default_template_src = template_tool_use_src;
        } else {
            default_template_src = CHATML_TEMPLATE_SRC;
        }
    }
    std::string token_bos = bos_token_override;
    std::string token_eos = eos_token_override;
    if (model) {
        const auto * vocab = llama_model_get_vocab(model);
        const auto get_token = [&](llama_token token, const char * name, const char * jinja_variable_name) {
            if (token == LLAMA_TOKEN_NULL) {
                if (default_template_src.find(jinja_variable_name) != std::string::npos
                    || template_tool_use_src.find(jinja_variable_name) != std::string::npos) {
                    LOG_WRN("common_chat_templates_init: warning: vocab does not have a %s token, jinja template won't work as intended.\n", name);
                }
                return std::string();
            }
            return common_token_to_piece(vocab, token, true);
        };
        token_bos = get_token(llama_vocab_bos(vocab), "BOS", "bos_token");
        token_eos = get_token(llama_vocab_eos(vocab), "EOS", "eos_token");
    }
    common_chat_templates_ptr tmpls(new common_chat_templates());
    tmpls->has_explicit_template = has_explicit_template;
    try {
        tmpls->template_default = std::make_unique<minja::chat_template>(default_template_src, token_bos, token_eos);
    } catch (const std::exception & e) {
        LOG_ERR("%s: failed to parse chat template (defaulting to chatml): %s \n", __func__, e.what());
        tmpls->template_default = std::make_unique<minja::chat_template>(CHATML_TEMPLATE_SRC, token_bos, token_eos);
    }
    if (!template_tool_use_src.empty()) {
        try {
            tmpls->template_tool_use = std::make_unique<minja::chat_template>(template_tool_use_src, token_bos, token_eos);
        } catch (const std::exception & e) {
            LOG_ERR("%s: failed to parse tool use chat template (ignoring it): %s\n", __func__, e.what());
        }
    }
    return tmpls;
}